

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

lhpage * lhNewPage(lhash_kv_engine *pEngine,unqlite_page *pRaw,lhpage *pMaster)

{
  lhpage *plVar1;
  ulong uVar2;
  lhpage *plVar3;
  
  plVar1 = (lhpage *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x60);
  if (plVar1 != (lhpage *)0x0) {
    uVar2 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&plVar1->pHash + uVar2 + 4) = 0;
      uVar2 = uVar2 + 4;
    } while (uVar2 < 0x5c);
    plVar1->pHash = pEngine;
    plVar1->pRaw = pRaw;
    plVar3 = pMaster;
    if (pMaster == (lhpage *)0x0) {
      plVar3 = plVar1;
    }
    plVar1->pMaster = plVar3;
    if (plVar3 != plVar1) {
      plVar1->pNextSlave = pMaster->pSlave;
      pMaster->pSlave = plVar1;
      pMaster->iSlave = pMaster->iSlave + 1;
    }
    pRaw->pUserData = plVar1;
  }
  return plVar1;
}

Assistant:

static lhpage * lhNewPage(
	lhash_kv_engine *pEngine, /* KV store which own this instance */
	unqlite_page *pRaw,       /* Raw page contents */
	lhpage *pMaster           /* Master page in case we are dealing with a slave page */
	)
{
	lhpage *pPage;
	/* Allocate a new instance */
	pPage = (lhpage *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhpage));
	if( pPage == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pPage,sizeof(lhpage));
	/* Fill-in the structure */
	pPage->pHash = pEngine;
	pPage->pRaw = pRaw;
	pPage->pMaster = pMaster ? pMaster /* Slave page */ : pPage /* Master page */ ;
	if( pPage->pMaster != pPage ){
		/* Slave page, attach it to its master */
		pPage->pNextSlave = pMaster->pSlave;
		pMaster->pSlave = pPage;
		pMaster->iSlave++;
	}
	/* Save this instance for future fast lookup */
	pRaw->pUserData = pPage;
	/* All done */
	return pPage;
}